

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O2

void assert_throws_macro_passes_basic_type(void)

{
  string *this;
  allocator local_19;
  
  this = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string(this,"throwing_function test",&local_19);
  __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

Ensure(assert_throws_macro_passes_basic_type) {
    assert_throws(std::string, throwing_function());
}